

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSMState::check_outputs(FSMState *this)

{
  key_type *__k;
  _Rb_tree_node_base *__k_00;
  iterator iVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  VarException *pVVar4;
  _Rb_tree_header *p_Var5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined8 *puVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  undefined1 local_e8 [8];
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  outputs;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_a8;
  string local_88;
  string local_68;
  FSMState *local_40;
  allocator_type local_31;
  
  std::
  _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_e8,&(this->parent_->outputs_)._M_h);
  p_Var5 = &(this->output_values_)._M_t._M_impl.super__Rb_tree_header;
  puVar6 = (undefined8 *)outputs._M_h._M_bucket_count;
  local_40 = this;
  do {
    if (puVar6 == (undefined8 *)0x0) {
      p_Var3 = (local_40->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if ((_Rb_tree_header *)p_Var3 == p_Var5) {
          std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_e8);
          return;
        }
        __k_00 = p_Var3 + 1;
        iVar2 = std::
                _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)local_e8,(key_type *)__k_00);
        if (iVar2.super__Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false>.
            _M_cur == (__node_type *)0x0) break;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      }
      pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
      (*((*(key_type *)__k_00)->super_IRNode)._vptr_IRNode[0x1f])(&local_a8);
      local_68.field_2._M_allocated_capacity =
           (size_type)(local_40->parent_->fsm_name_)._M_dataplus._M_p;
      local_68.field_2._8_8_ = (local_40->parent_->fsm_name_)._M_string_length;
      local_68._M_dataplus._M_p =
           (pointer)local_a8.
                    super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_68._M_string_length =
           (size_type)
           local_a8.
           super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      bVar7 = fmt::v7::to_string_view<char,_0>("{0} is not specified in FSM {1}");
      format_str.data_ = (char *)bVar7.size_;
      format_str.size_ = 0xdd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar7.data_,format_str,args);
      outputs._M_h._M_single_bucket = *(__node_base_ptr *)__k_00;
      __l._M_len = 1;
      __l._M_array = (iterator)&outputs._M_h._M_single_bucket;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_68,__l,&local_31);
      VarException::VarException
                (pVVar4,&local_88,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_68);
      __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    __k = (key_type *)(puVar6 + 1);
    iVar1 = std::
            _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_kratos::Var_*>,_std::_Select1st<std::pair<kratos::Var_*const,_kratos::Var_*>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
            ::find(&(this->output_values_)._M_t,__k);
    if ((_Rb_tree_header *)iVar1._M_node == p_Var5) {
      if (puVar6[2] == 0) {
        pVVar4 = (VarException *)__cxa_allocate_exception(0x10);
        (*((*__k)->super_IRNode)._vptr_IRNode[0x1f])(&local_88);
        local_a8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_dataplus._M_p;
        local_a8.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._M_string_length;
        bVar7 = fmt::v7::to_string_view<char,_0>("{0} not specified");
        format_str_00.data_ = (char *)bVar7.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_a8;
        fmt::v7::detail::vformat_abi_cxx11_(&local_68,(detail *)bVar7.data_,format_str_00,args_00);
        outputs._M_h._M_single_bucket = (__node_base_ptr)*__k;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&outputs._M_h._M_single_bucket;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  (&local_a8,__l_00,&local_31);
        VarException::VarException(pVVar4,&local_68,&local_a8);
        __cxa_throw(pVVar4,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(*__k)->super_enable_shared_from_this<kratos::Var>);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(puVar6[2] + 0x68));
      output(local_40,(shared_ptr<kratos::Var> *)&local_68,(shared_ptr<kratos::Var> *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
    }
    puVar6 = (undefined8 *)*puVar6;
  } while( true );
}

Assistant:

void FSMState::check_outputs() {
    auto outputs = parent_->outputs();
    for (auto const& [output, default_] : outputs) {
        if (output_values_.find(output) == output_values_.end()) {
            if (!default_) {
                throw VarException(::format("{0} not specified", output->to_string()), {output});
            } else {
                // insert it to the output values
                this->output(output->shared_from_this(), default_->shared_from_this());
            }
        }
    }
    // the other way, this is to ensure a bijection
    for (auto const& iter : output_values_) {
        auto const& output = iter.first;
        if (outputs.find(output) == outputs.end()) {
            throw VarException(::format("{0} is not specified in FSM {1}", output->to_string(),
                                        parent_->fsm_name()),
                               {output});
        }
    }
}